

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void booke206_update_mas_tlb_miss
               (CPUPPCState_conflict2 *env,target_ulong address,int rw,int mmu_idx)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  uint32_t local_2c;
  _Bool local_26;
  _Bool use_epid;
  uint32_t missed_tid;
  _Bool pr;
  int iStack_20;
  _Bool as;
  uint32_t epid;
  int mmu_idx_local;
  int rw_local;
  target_ulong address_local;
  CPUPPCState_conflict2 *env_local;
  
  local_2c = 0;
  iStack_20 = mmu_idx;
  epid = rw;
  _mmu_idx_local = address;
  address_local = (target_ulong)env;
  _Var1 = mmubooke206_get_as(env,mmu_idx,&missed_tid,&use_epid,&local_26);
  if (epid == 2) {
    use_epid = (*(ulong *)(address_local + 0x280) >> 5 & 1) != 0;
  }
  *(ulong *)(address_local + 0x1e98) = *(ulong *)(address_local + 0x1eb8) & 0x30000000;
  *(ulong *)(address_local + 0x1ea0) = *(ulong *)(address_local + 0x1eb8) & 0xf80;
  *(ulong *)(address_local + 0x1ea8) = *(ulong *)(address_local + 0x1eb8) & 0x1f;
  *(undefined8 *)(address_local + 0x1eb0) = 0;
  *(undefined8 *)(address_local + 0x1ec8) = 0;
  *(undefined8 *)(address_local + 0x2898) = 0;
  if ((use_epid & 1U) != 0) {
    *(ulong *)(address_local + 0x1ea0) = *(ulong *)(address_local + 0x1ea0) | 0x1000;
    *(ulong *)(address_local + 0x1ec8) = *(ulong *)(address_local + 0x1ec8) | 1;
  }
  *(ulong *)(address_local + 0x1ea0) = *(ulong *)(address_local + 0x1ea0) | 0x80000000;
  *(target_ulong *)(address_local + 0x1ea8) =
       _mmu_idx_local & 0xfffffffffffff000 | *(ulong *)(address_local + 0x1ea8);
  if (_Var1) {
    local_2c = missed_tid;
    *(ulong *)(address_local + 0x1ec8) =
         (ulong)(missed_tid << 0x10) | *(ulong *)(address_local + 0x1ec8);
  }
  else {
    uVar3 = *(ulong *)(address_local + 0x1eb8) & 0x30000;
    if (uVar3 == 0) {
      local_2c = (uint32_t)*(undefined8 *)(address_local + 0xc98);
    }
    else if (uVar3 == 0x10000) {
      local_2c = (uint32_t)*(undefined8 *)(address_local + 0x1ee0);
    }
    else if (uVar3 == 0x20000) {
      local_2c = (uint32_t)*(undefined8 *)(address_local + 0x1ee8);
    }
    *(ulong *)(address_local + 0x1ec8) =
         *(long *)(address_local + 0xc98) << 0x10 | *(ulong *)(address_local + 0x1ec8);
  }
  *(ulong *)(address_local + 0x1ea0) =
       (ulong)(local_2c << 0x10) | *(ulong *)(address_local + 0x1ea0);
  *(ulong *)(address_local + 0x1e98) =
       (long)(*(int *)(address_local + 0xad4) << 0x10) | *(ulong *)(address_local + 0x1e98);
  *(int *)(address_local + 0xad4) = *(int *)(address_local + 0xad4) + 1;
  iVar2 = booke206_tlb_ways((CPUPPCState_conflict2 *)address_local,0);
  *(uint *)(address_local + 0xad4) = iVar2 - 1U & *(uint *)(address_local + 0xad4);
  *(ulong *)(address_local + 0x1e98) =
       (long)*(int *)(address_local + 0xad4) | *(ulong *)(address_local + 0x1e98);
  return;
}

Assistant:

static void booke206_update_mas_tlb_miss(CPUPPCState *env, target_ulong address,
                                     int rw, int mmu_idx)
{
    uint32_t epid;
    bool as, pr;
    uint32_t missed_tid = 0;
    bool use_epid = mmubooke206_get_as(env, mmu_idx, &epid, &as, &pr);
    if (rw == 2) {
        as = msr_ir;
    }
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS6] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    /* AS */
    if (as) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
        env->spr[SPR_BOOKE_MAS6] |= MAS6_SAS;
    }

    env->spr[SPR_BOOKE_MAS1] |= MAS1_VALID;
    env->spr[SPR_BOOKE_MAS2] |= address & MAS2_EPN_MASK;

    if (!use_epid) {
        switch (env->spr[SPR_BOOKE_MAS4] & MAS4_TIDSELD_PIDZ) {
        case MAS4_TIDSELD_PID0:
            missed_tid = env->spr[SPR_BOOKE_PID];
            break;
        case MAS4_TIDSELD_PID1:
            missed_tid = env->spr[SPR_BOOKE_PID1];
            break;
        case MAS4_TIDSELD_PID2:
            missed_tid = env->spr[SPR_BOOKE_PID2];
            break;
        }
        env->spr[SPR_BOOKE_MAS6] |= env->spr[SPR_BOOKE_PID] << 16;
    } else {
        missed_tid = epid;
        env->spr[SPR_BOOKE_MAS6] |= missed_tid << 16;
    }
    env->spr[SPR_BOOKE_MAS1] |= (missed_tid << MAS1_TID_SHIFT);


    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}